

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionTests::initiatorFixtureinitiatorResetLogonWithoutResetSeqNumInResponseHelper::
~initiatorFixtureinitiatorResetLogonWithoutResetSeqNumInResponseHelper
          (initiatorFixtureinitiatorResetLogonWithoutResetSeqNumInResponseHelper *this)

{
  ~initiatorFixtureinitiatorResetLogonWithoutResetSeqNumInResponseHelper
            ((initiatorFixtureinitiatorResetLogonWithoutResetSeqNumInResponseHelper *)
             &this[-1].m_details);
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, initiatorResetLogonWithoutResetSeqNumInResponse)
{
  object->setResponder( this );
  object->next();
  object->next( createLogon( "ISLD", "TW", 1 ), UtcTimeStamp() );
  CHECK_EQUAL( 2, object->getExpectedSenderNum() );
  CHECK_EQUAL( 2, object->getExpectedTargetNum() );

  object->next( createLogout( "ISLD", "TW", 2 ), UtcTimeStamp() );
  CHECK_EQUAL( 3, object->getExpectedSenderNum() );
  CHECK_EQUAL( 3, object->getExpectedTargetNum() );

  object->setResetOnLogon( true );
  object->next();
  FIX42::Logon logon = createLogon( "ISLD", "TW", 1 );
  object->next( logon, UtcTimeStamp() );
  CHECK( object->isLoggedOn() );
}